

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_get.c
# Opt level: O3

char * nhr_request_create_header_GET(nhr_request r,size_t *header_size)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *mem;
  char *mem_00;
  size_t sVar5;
  char *__s;
  long lVar6;
  size_t sVar7;
  long lVar8;
  size_t parameters_len;
  size_t headers_len;
  size_t local_48;
  size_t *local_40;
  size_t local_38;
  
  mem = (char *)0x0;
  local_38 = 0;
  local_48 = 0;
  local_40 = header_size;
  sVar3 = strlen(r->path);
  sVar4 = strlen(r->host);
  if (r->http_headers == (_nhr_map_node *)0x0) {
    sVar7 = 0;
  }
  else {
    mem = nhr_request_http_headers(r->http_headers,&local_38);
    sVar7 = local_38;
  }
  if (mem == (char *)0x0) {
    sVar7 = 0;
  }
  if (r->parameters == (_nhr_map_node *)0x0) {
    sVar5 = 0;
    mem_00 = (char *)0x0;
  }
  else {
    mem_00 = nhr_request_url_encoded_parameters(r->parameters,&local_48);
    sVar5 = local_48;
  }
  if (mem_00 == (char *)0x0) {
    sVar5 = 0;
  }
  __s = (char *)nhr_malloc(sVar5 + sVar3 + sVar4 + sVar7 + 0x100);
  if (mem_00 == (char *)0x0) {
    iVar1 = sprintf(__s,"%s %s HTTP/%s\r\n","GET",r->path,k_nhr_request_http_ver);
  }
  else {
    iVar1 = sprintf(__s,"%s %s?%s HTTP/%s\r\n","GET",r->path,mem_00);
  }
  if (r->port == 0x50) {
    iVar2 = sprintf(__s + iVar1,"Host: %s\r\n",r->host);
  }
  else {
    iVar2 = sprintf(__s + iVar1,"Host: %s:%i\r\n",r->host);
  }
  lVar8 = (long)iVar2 + (long)iVar1;
  if (mem == (char *)0x0) {
    *(undefined2 *)(__s + lVar8) = *(undefined2 *)k_nhr_CRLF;
    lVar6 = 2;
  }
  else {
    iVar1 = sprintf(__s + lVar8,"%s\r\n\r\n",mem);
    lVar6 = (long)iVar1;
  }
  sVar7 = lVar6 + lVar8;
  nhr_free(mem);
  nhr_free(mem_00);
  __s[sVar7] = '\0';
  *local_40 = sVar7;
  return __s;
}

Assistant:

char * nhr_request_create_header_GET(nhr_request r, size_t * header_size) {
    size_t buff_size = 0, writed = 0, headers_len = 0, parameters_len = 0;
    char * buff = NULL, *headers = NULL, *parameters = NULL;
    
    buff_size = strlen(r->path);
    buff_size += strlen(r->host);
    
    headers = r->http_headers ? nhr_request_http_headers(r->http_headers, &headers_len) : NULL;
    if (headers) buff_size += headers_len;
    
    parameters = r->parameters ? nhr_request_url_encoded_parameters(r->parameters, &parameters_len) : NULL;
    if (parameters) buff_size += parameters_len;
    
    buff_size += 1 << 8; // extra size for formatting strings
    buff = (char *)nhr_malloc(buff_size);
    
    if (parameters) {
        writed = nhr_sprintf(buff, buff_size, "%s %s?%s HTTP/%s\r\n", k_nhr_GET, r->path, parameters, k_nhr_request_http_ver);
    } else {
        writed = nhr_sprintf(buff, buff_size, "%s %s HTTP/%s\r\n", k_nhr_GET, r->path, k_nhr_request_http_ver);
    }
    
    if (r->port == 80) {
        writed += nhr_sprintf(buff + writed, buff_size - writed, "Host: %s\r\n", r->host);
    } else {
        writed += nhr_sprintf(buff + writed, buff_size - writed, "Host: %s:%i\r\n", r->host, (int)r->port);
    }
    
    if (headers) {
        writed += nhr_sprintf(buff + writed, buff_size - writed, "%s\r\n\r\n", headers);
    } else {
        memcpy(buff + writed, k_nhr_CRLF, k_nhr_CRLF_length);
        writed += k_nhr_CRLF_length;
    }
    
    nhr_free(headers);
    nhr_free(parameters);
    buff[writed] = 0;
    *header_size = writed;
    return buff;
}